

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.c
# Opt level: O0

void test_blocking_io_errors(config config)

{
  config config_00;
  undefined1 auVar1 [80];
  config config_01;
  int iVar3;
  char *pcVar4;
  size_t sVar5;
  long lVar6;
  long lVar7;
  int *piVar8;
  char *pcVar9;
  timeval tv;
  char *eptr;
  char *p;
  char *field;
  int minor;
  int major;
  void *_reply;
  redisReply *reply;
  redisContext *c;
  undefined1 auVar2 [32];
  
  pcVar9 = &stack0x00000008;
  auVar1 = config._0_80_;
  config_00.ssl.key = pcVar9;
  auVar2 = auVar1._8_32_;
  config_00.type = auVar1._0_4_;
  config_00._4_4_ = auVar1._4_4_;
  config_00.tcp.host = (char *)auVar2._0_8_;
  config_00.tcp.port = auVar2._8_4_;
  config_00.tcp._12_4_ = auVar2._12_4_;
  config_00.tcp.timeout.tv_sec = SUB168(auVar2._16_16_,0);
  config_00.tcp.timeout.tv_usec = SUB168(auVar2._16_16_,8);
  config_00.unix_sock.path = (char *)auVar1._40_8_;
  config_00.ssl.host = (char *)auVar1._48_8_;
  config_00.ssl.port = auVar1._56_4_;
  config_00.ssl._12_4_ = auVar1._60_4_;
  config_00.ssl.ca_cert = (char *)auVar1._64_8_;
  config_00.ssl.cert = (char *)auVar1._72_8_;
  reply = (redisReply *)do_connect(config_00);
  _reply = (void *)redisCommand(reply,"INFO");
  pcVar4 = strstr(*(char **)((long)_reply + 0x20),"redis_version:");
  sVar5 = strlen("redis_version:");
  lVar6 = strtol(pcVar4 + sVar5,(char **)&tv.tv_usec,10);
  lVar7 = strtol((char *)(tv.tv_usec + 1),(char **)&tv.tv_usec,10);
  freeReplyObject(_reply);
  tests = tests + 1;
  printf("#%02d ");
  printf("Returns I/O error when the connection is lost: ");
  _reply = (void *)redisCommand(reply,"QUIT");
  if (((int)lVar6 < 3) && (((int)lVar6 != 2 || ((int)lVar7 < 1)))) {
    if (_reply == (void *)0x0) {
      printf("\x1b[0;32mPASSED\x1b[0;0m\n");
    }
    else {
      printf("\x1b[0;31mFAILED\x1b[0;0m\n");
      fails = fails + 1;
    }
  }
  else {
    iVar3 = strcasecmp(*(char **)((long)_reply + 0x20),"OK");
    if ((iVar3 == 0) && (iVar3 = redisGetReply(reply,&minor), iVar3 == -1)) {
      printf("\x1b[0;32mPASSED\x1b[0;0m\n");
    }
    else {
      printf("\x1b[0;31mFAILED\x1b[0;0m\n");
      fails = fails + 1;
    }
    freeReplyObject(_reply);
  }
  if (((int)reply->integer == 3) &&
     (iVar3 = strcmp((char *)((long)&reply->integer + 4),"Server closed the connection"), iVar3 == 0
     )) {
    redisFree(reply);
    config_01.ssl.key = pcVar9;
    config_01._0_80_ = *(undefined1 (*) [80])(pcVar9 + 8);
    reply = (redisReply *)do_connect(config_01);
    tests = tests + 1;
    printf("#%02d ");
    printf("Returns I/O error on socket timeout: ");
    tv.tv_sec = 1000;
    iVar3 = redisSetTimeout(reply,0,1000);
    if (iVar3 == 0) {
      iVar3 = redisGetReply(reply,&minor);
      if (((iVar3 == -1) && ((int)reply->integer == 1)) &&
         (piVar8 = __errno_location(), *piVar8 == 0xb)) {
        printf("\x1b[0;32mPASSED\x1b[0;0m\n");
      }
      else {
        printf("\x1b[0;31mFAILED\x1b[0;0m\n");
        fails = fails + 1;
      }
      redisFree(reply);
      return;
    }
    __assert_fail("redisSetTimeout(c,tv) == REDIS_OK",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/DGuco[P]exhiredis/hiredis/test.c"
                  ,0x2b1,"void test_blocking_io_errors(struct config)");
  }
  __assert_fail("c->err == REDIS_ERR_EOF && strcmp(c->errstr,\"Server closed the connection\") == 0"
                ,
                "/workspace/llm4binary/github/license_all_cmakelists_25/DGuco[P]exhiredis/hiredis/test.c"
                ,0x2ab,"void test_blocking_io_errors(struct config)");
}

Assistant:

static void test_blocking_io_errors(struct config config) {
    redisContext *c;
    redisReply *reply;
    void *_reply;
    int major, minor;

    /* Connect to target given by config. */
    c = do_connect(config);
    {
        /* Find out Redis version to determine the path for the next test */
        const char *field = "redis_version:";
        char *p, *eptr;

        reply = redisCommand(c,"INFO");
        p = strstr(reply->str,field);
        major = strtol(p+strlen(field),&eptr,10);
        p = eptr+1; /* char next to the first "." */
        minor = strtol(p,&eptr,10);
        freeReplyObject(reply);
    }

    test("Returns I/O error when the connection is lost: ");
    reply = redisCommand(c,"QUIT");
    if (major > 2 || (major == 2 && minor > 0)) {
        /* > 2.0 returns OK on QUIT and read() should be issued once more
         * to know the descriptor is at EOF. */
        test_cond(strcasecmp(reply->str,"OK") == 0 &&
            redisGetReply(c,&_reply) == REDIS_ERR);
        freeReplyObject(reply);
    } else {
        test_cond(reply == NULL);
    }

    /* On 2.0, QUIT will cause the connection to be closed immediately and
     * the read(2) for the reply on QUIT will set the error to EOF.
     * On >2.0, QUIT will return with OK and another read(2) needed to be
     * issued to find out the socket was closed by the server. In both
     * conditions, the error will be set to EOF. */
    assert(c->err == REDIS_ERR_EOF &&
        strcmp(c->errstr,"Server closed the connection") == 0);
    redisFree(c);

    c = do_connect(config);
    test("Returns I/O error on socket timeout: ");
    struct timeval tv = { 0, 1000 };
    assert(redisSetTimeout(c,tv) == REDIS_OK);
    test_cond(redisGetReply(c,&_reply) == REDIS_ERR &&
        c->err == REDIS_ERR_IO && errno == EAGAIN);
    redisFree(c);
}